

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_destroy(char *fname,fdb_config *fdbconfig)

{
  bool bVar1;
  void *in_RSI;
  char *in_RDI;
  char *filename;
  fdb_status status;
  filemgr_config fconfig;
  fdb_config config;
  fdb_config *in_stack_fffffffffffff988;
  fdb_config *in_stack_fffffffffffff990;
  undefined1 local_278 [24];
  fdb_config *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  fdb_status local_174;
  filemgr_config local_170;
  undefined1 local_110 [8];
  fdb_config *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char local_e2;
  fdb_status local_4;
  
  if (in_RSI == (void *)0x0) {
    get_default_config();
    memcpy(local_110,local_278,0xf8);
  }
  else {
    bVar1 = validate_fdb_config(in_stack_fffffffffffff988);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    memcpy(local_110,in_RSI,0xf8);
  }
  strncpy(&stack0xfffffffffffff988,in_RDI,0x400);
  bVar1 = compactor_is_valid_mode(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  if (bVar1) {
    _fdb_init_file_config(in_stack_fffffffffffff990,(filemgr_config *)in_stack_fffffffffffff988);
    filemgr_mutex_openlock((filemgr_config *)0x163573);
    local_174 = filemgr_destroy_file(&stack0xfffffffffffff988,&local_170,(hash *)0x0);
    if ((local_174 == FDB_RESULT_SUCCESS) || (local_e2 == '\x01')) {
      if ((local_e2 == '\x01') &&
         (local_174 = compactor_destroy_file(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8),
         local_174 != FDB_RESULT_SUCCESS)) {
        filemgr_mutex_openunlock();
        local_4 = local_174;
      }
      else {
        filemgr_mutex_openunlock();
        local_4 = local_174;
      }
    }
    else {
      filemgr_mutex_openunlock();
      local_4 = local_174;
    }
  }
  else {
    local_4 = FDB_RESULT_INVALID_COMPACTION_MODE;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_destroy(const char *fname,
                       fdb_config *fdbconfig)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    struct filemgr_config fconfig;
    fdb_status status = FDB_RESULT_SUCCESS;
    char *filename = (char *)alca(uint8_t, FDB_MAX_FILENAME_LEN);

    if (fdbconfig) {
        if (validate_fdb_config(fdbconfig)) {
            config = *fdbconfig;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config = get_default_config();
    }

    strncpy(filename, fname, FDB_MAX_FILENAME_LEN);

    if (!compactor_is_valid_mode(filename, &config)) {
        status = FDB_RESULT_INVALID_COMPACTION_MODE;
        return status;
    }

    _fdb_init_file_config(&config, &fconfig);

    filemgr_mutex_openlock(&fconfig);

    // Destroy file whose name is exactly matched.
    // In auto compaction mode, exact matching file name will not exist in
    // file system, so we allow failure returned by this function.
    status = filemgr_destroy_file(filename, &fconfig, NULL);
    if (status != FDB_RESULT_SUCCESS &&
        config.compaction_mode != FDB_COMPACTION_AUTO) {
        filemgr_mutex_openunlock();
        return status;
    }

    if (config.compaction_mode == FDB_COMPACTION_AUTO) {
        // Destroy all files whose prefix is matched.
        status = compactor_destroy_file(filename, &config);
        if (status != FDB_RESULT_SUCCESS) {
            filemgr_mutex_openunlock();
            return status;
        }
    }

    filemgr_mutex_openunlock();

    return status;
}